

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderLogCase::iterate(ShaderLogCase *this)

{
  TestLog *log;
  int iVar1;
  ContextType type;
  GLSLVersion version;
  deUint32 type_00;
  GLuint shader;
  GLenum GVar2;
  undefined4 extraout_var;
  char *__s;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  StateQueryMemoryWriteGuard<int> logLen;
  CallLogWrapper gl;
  string source;
  char *brokenSource;
  ResultCollector result;
  string glslVersionDecl;
  long *local_2e0;
  undefined8 local_2d8;
  long local_2d0;
  undefined8 uStack_2c8;
  string local_2c0;
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  StateQueryMemoryWriteGuard<int> local_260;
  undefined1 local_250 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  long local_228 [2];
  long *local_218;
  code *local_210 [2];
  ResultCollector local_200;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1b32ab9);
  tcu::ResultCollector::ResultCollector(&local_200,log,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_250,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,__s,(allocator<char> *)&local_280);
  local_238._M_allocated_capacity = (size_type)local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_1b0,(pointer)((long)local_1a8 + (long)local_1b0));
  std::__cxx11::string::append(local_238._M_local_buf);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_218 = (long *)local_238._M_allocated_capacity;
  local_260.m_preguard = -0x21212122;
  local_260.m_value = -0x21212122;
  local_260.m_postguard = -0x21212122;
  local_250[0x10] = true;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Trying to compile broken shader source.",0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  type_00 = glu::getGLShaderType(this->m_shaderType);
  shader = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)local_250,type_00);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_250);
  if (GVar2 != 0) {
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Got Error ","");
    local_210[0] = glu::getErrorName;
    local_210[1]._0_4_ = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2c0,local_210);
    uVar8 = 0xf;
    if (local_2a0 != local_290) {
      uVar8 = local_290[0];
    }
    if (uVar8 < local_2c0._M_string_length + local_298) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        uVar9 = local_2c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_2c0._M_string_length + local_298) goto LAB_014e10cd;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
    }
    else {
LAB_014e10cd:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0._M_dataplus._M_p)
      ;
    }
    local_2e0 = &local_2d0;
    plVar4 = puVar3 + 2;
    if ((long *)*puVar3 == plVar4) {
      local_2d0 = *plVar4;
      uStack_2c8 = puVar3[3];
    }
    else {
      local_2d0 = *plVar4;
      local_2e0 = (long *)*puVar3;
    }
    local_2d8 = puVar3[1];
    *puVar3 = plVar4;
    puVar3[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_270 = *plVar5;
      lStack_268 = plVar4[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar5;
      local_280 = (long *)*plVar4;
    }
    local_278 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_280);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar6) {
      local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar4[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar4;
    }
    local_1a8 = (_func_int **)plVar4[1];
    *plVar4 = (long)paVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
  }
  glu::CallLogWrapper::glShaderSource
            ((CallLogWrapper *)local_250,shader,1,(GLchar **)&local_218,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader((CallLogWrapper *)local_250,shader);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_250);
  if (GVar2 != 0) {
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Got Error ","");
    local_210[0] = glu::getErrorName;
    local_210[1]._0_4_ = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2c0,local_210);
    uVar8 = 0xf;
    if (local_2a0 != local_290) {
      uVar8 = local_290[0];
    }
    if (uVar8 < local_2c0._M_string_length + local_298) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        uVar9 = local_2c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_2c0._M_string_length + local_298) goto LAB_014e1343;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
    }
    else {
LAB_014e1343:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0._M_dataplus._M_p)
      ;
    }
    local_2e0 = &local_2d0;
    plVar4 = puVar3 + 2;
    if ((long *)*puVar3 == plVar4) {
      local_2d0 = *plVar4;
      uStack_2c8 = puVar3[3];
    }
    else {
      local_2d0 = *plVar4;
      local_2e0 = (long *)*puVar3;
    }
    local_2d8 = puVar3[1];
    *puVar3 = plVar4;
    puVar3[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_270 = *plVar5;
      lStack_268 = plVar4[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar5;
      local_280 = (long *)*plVar4;
    }
    local_278 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_280);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar6) {
      local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar4[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar4;
    }
    local_1a8 = (_func_int **)plVar4[1];
    *plVar4 = (long)paVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
  }
  glu::CallLogWrapper::glGetShaderiv((CallLogWrapper *)local_250,shader,0x8b84,&local_260.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&local_260,&local_200);
  if ((char)local_260.m_value == -0x22) {
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      if (uVar7 == 3) break;
      uVar8 = uVar7 + 1;
    } while (*(char *)((long)&local_260.m_value + uVar7 + 1) == -0x22);
    if (uVar7 < 3) goto LAB_014e154b;
  }
  else {
LAB_014e154b:
    verifyInfoLogQuery((Functional *)&local_200,(ResultCollector *)local_250,
                       (CallLogWrapper *)((ulong)local_260._0_8_ >> 0x20),shader,0x193085c,0,
                       "glGetShaderInfoLog");
  }
  glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)local_250,shader);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_250);
  if (GVar2 == 0) goto LAB_014e17d4;
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Got Error ","");
  local_210[0] = glu::getErrorName;
  local_210[1]._0_4_ = GVar2;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2c0,local_210);
  uVar8 = 0xf;
  if (local_2a0 != local_290) {
    uVar8 = local_290[0];
  }
  if (uVar8 < local_2c0._M_string_length + local_298) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      uVar9 = local_2c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_2c0._M_string_length + local_298) goto LAB_014e1625;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_014e1625:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0._M_dataplus._M_p);
  }
  local_2e0 = &local_2d0;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_2d0 = *plVar4;
    uStack_2c8 = puVar3[3];
  }
  else {
    local_2d0 = *plVar4;
    local_2e0 = (long *)*puVar3;
  }
  local_2d8 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_270 = *plVar5;
    lStack_268 = plVar4[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar5;
    local_280 = (long *)*plVar4;
  }
  local_278 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_280);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar6) {
    local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_1a0[0]._8_8_ = plVar4[3];
    local_1b0 = (undefined1  [8])local_1a0;
  }
  else {
    local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_1b0 = (undefined1  [8])*plVar4;
  }
  local_1a8 = (_func_int **)plVar4[1];
  *plVar4 = (long)paVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
LAB_014e17d4:
  tcu::ResultCollector::setTestContextResult
            (&local_200,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((long *)local_238._M_allocated_capacity != local_228) {
    operator_delete((void *)local_238._M_allocated_capacity,local_228[0] + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_prefix._M_dataplus._M_p != &local_200.m_prefix.field_2) {
    operator_delete(local_200.m_prefix._M_dataplus._M_p,
                    local_200.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

ShaderLogCase::IterateResult ShaderLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	tcu::ResultCollector					result			(m_testCtx.getLog());
	glu::CallLogWrapper						gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	deUint32								shader			= 0;
	const std::string						source			= brokenShaderSource(m_context.getRenderContext().getType());
	const char* const						brokenSource	= source.c_str();
	StateQueryMemoryWriteGuard<glw::GLint>	logLen;

	gl.enableLogging(true);

	m_testCtx.getLog() << tcu::TestLog::Message << "Trying to compile broken shader source." << tcu::TestLog::EndMessage;

	shader = gl.glCreateShader(glu::getGLShaderType(m_shaderType));
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "create shader");

	gl.glShaderSource(shader, 1, &brokenSource, DE_NULL);
	gl.glCompileShader(shader);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "compile");

	gl.glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logLen);
	logLen.verifyValidity(result);

	if (!logLen.isUndefined())
		verifyInfoLogQuery(result, gl, logLen, shader, &glu::CallLogWrapper::glGetShaderInfoLog, "glGetShaderInfoLog");

	gl.glDeleteShader(shader);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "delete");

	result.setTestContextResult(m_testCtx);
	return STOP;
}